

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O1

void __thiscall
FxConstant::FxConstant(FxConstant *this,PType *type,VMValue *vmval,FScriptPosition *pos)

{
  VM_UBYTE VVar1;
  ExpVal local_40;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ExprType = EFX_Constant;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
  (this->value).field_1.Int = 0;
  (this->value).Type = type;
  (this->super_FxExpression).ValueType = type;
  (this->super_FxExpression).isresolved = true;
  (this->super_FxExpression).NeedResult = true;
  VVar1 = (vmval->field_0).field_3.Type;
  if (VVar1 == '\x01') {
    (this->value).field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)(vmval->field_0).field_1.a;
  }
  else if (VVar1 == '\x02') {
    local_40.Type = (PType *)TypeString;
    FString::AttachToOther((FString *)&local_40.field_1,(FString *)vmval);
    ExpVal::operator=(&this->value,&local_40);
    if (local_40.Type == (PType *)TypeString) {
      FString::~FString((FString *)&local_40.field_1);
    }
  }
  else if (VVar1 == '\x03') {
    (this->value).field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)(vmval->field_0).field_1.a;
  }
  else {
    (this->value).field_1.Int = (vmval->field_0).i;
  }
  return;
}

Assistant:

FxConstant(PType *type, VMValue &vmval, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = type;
		isresolved = true;
		switch (vmval.Type)
		{
		default:
		case REGT_INT:
			value.Int = vmval.i;
			break;

		case REGT_FLOAT:
			value.Float = vmval.f;
			break;

		case REGT_STRING:
			value = ExpVal(vmval.s());
			break;

		case REGT_POINTER:
			value.pointer = vmval.a;
			break;
		}
	}